

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonetree.h
# Opt level: O0

ZoneTreeNode *
asmjit::v1_14::ZoneTree<asmjit::v1_14::ConstPool::Node>::_singleRotate
          (ZoneTreeNode *root,size_t dir)

{
  ZoneTreeNode *pZVar1;
  ulong uVar2;
  ZoneTreeNode *saveChild;
  ZoneTreeNode *save;
  size_t dir_local;
  ZoneTreeNode *root_local;
  
  pZVar1 = (ZoneTreeNode *)
           (*(ulong *)(root + (ulong)((dir != 0 ^ 0xffU) & 1) * 8) & 0xfffffffffffffffe);
  uVar2 = (ulong)((dir != 0 ^ 0xffU) & 1);
  *(ulong *)(root + uVar2 * 8) =
       *(ulong *)(root + uVar2 * 8) & 1 | *(ulong *)(pZVar1 + dir * 8) & 0xfffffffffffffffe;
  *(ulong *)(pZVar1 + dir * 8) = *(ulong *)(pZVar1 + dir * 8) & 1 | (ulong)root;
  *(ulong *)root = *(ulong *)root | 1;
  *(ulong *)pZVar1 = *(ulong *)pZVar1 & 0xfffffffffffffffe;
  return pZVar1;
}

Assistant:

static inline ZoneTreeNode* _singleRotate(ZoneTreeNode* ASMJIT_NONNULL(root), size_t dir) noexcept {
    ZoneTreeNode* save = root->_getChild(!dir);
    ASMJIT_ASSUME(save != nullptr);

    ZoneTreeNode* saveChild = save->_getChild(dir);
    root->_setChild(!dir, saveChild);
    save->_setChild( dir, root);
    root->_makeRed();
    save->_makeBlack();
    return save;
  }